

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> * __thiscall
libtorrent::torrent_handle::get_download_queue
          (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
           *__return_storage_ptr__,torrent_handle *this)

{
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sync_call<void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*>
            (this,0x2e2478,
             (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
              **)0x0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<partial_piece_info> torrent_handle::get_download_queue() const
	{
		std::vector<partial_piece_info> queue;
		sync_call(&aux::torrent::get_download_queue, &queue);
		return queue;
	}